

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O1

void Abc_SclReadSurface(Vec_Str_t *vOut,int *pPos,SC_Surface *p)

{
  byte bVar1;
  uint uVar2;
  float *pfVar3;
  uint *puVar4;
  void *pvVar5;
  void **ppvVar6;
  Vec_Int_t *p_00;
  int *piVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  float fVar13;
  
  uVar2 = *pPos;
  iVar9 = uVar2 + 1;
  *pPos = iVar9;
  if (-1 < (int)uVar2) {
    bVar8 = 0;
    uVar10 = 0;
    do {
      if (vOut->nSize <= (int)uVar2) break;
      bVar1 = vOut->pArray[uVar2];
      if (-1 < (char)bVar1) {
        uVar10 = (uint)bVar1 << (bVar8 & 0x1f) | uVar10;
        if (uVar10 == 0) goto LAB_003d83ae;
        goto LAB_003d82f5;
      }
      uVar10 = uVar10 | (bVar1 & 0x7f) << (bVar8 & 0x1f);
      iVar11 = uVar2 + 2;
      uVar2 = uVar2 + 1;
      bVar8 = bVar8 + 7;
      *pPos = iVar11;
    } while (-1 < iVar9);
  }
  goto LAB_003d83ef;
LAB_003d841c:
  do {
    fVar13 = Vec_StrGetF(vOut,pPos);
    uVar2 = (p->vIndex1).nCap;
    if ((p->vIndex1).nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        pfVar3 = (p->vIndex1).pArray;
        if (pfVar3 == (float *)0x0) {
          pfVar3 = (float *)malloc(0x40);
        }
        else {
          pfVar3 = (float *)realloc(pfVar3,0x40);
        }
        (p->vIndex1).pArray = pfVar3;
        iVar9 = 0x10;
      }
      else {
        iVar9 = uVar2 * 2;
        if (iVar9 <= (int)uVar2) goto LAB_003d84a6;
        pfVar3 = (p->vIndex1).pArray;
        if (pfVar3 == (float *)0x0) {
          pfVar3 = (float *)malloc((ulong)uVar2 << 3);
        }
        else {
          pfVar3 = (float *)realloc(pfVar3,(ulong)uVar2 << 3);
        }
        (p->vIndex1).pArray = pfVar3;
      }
      (p->vIndex1).nCap = iVar9;
    }
LAB_003d84a6:
    iVar9 = (p->vIndex1).nSize;
    (p->vIndex1).nSize = iVar9 + 1;
    (p->vIndex1).pArray[iVar9] = fVar13;
    Vec_IntPush(&p->vIndex1I,(int)(fVar13 * 1000.0));
    uVar10 = uVar10 - 1;
  } while (uVar10 != 0);
LAB_003d84d5:
  if (0 < (p->vIndex0).nSize) {
    iVar9 = 0;
    do {
      uVar2 = (p->vIndex1).nSize;
      puVar4 = (uint *)malloc(0x10);
      if (uVar2 - 1 < 0xf) {
        uVar2 = 0x10;
      }
      puVar4[1] = 0;
      *puVar4 = uVar2;
      if (uVar2 == 0) {
        pvVar5 = (void *)0x0;
      }
      else {
        pvVar5 = malloc((long)(int)uVar2 << 2);
      }
      *(void **)(puVar4 + 2) = pvVar5;
      uVar2 = (p->vData).nCap;
      if ((p->vData).nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          ppvVar6 = (p->vData).pArray;
          if (ppvVar6 == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(ppvVar6,0x80);
          }
          (p->vData).pArray = ppvVar6;
          iVar11 = 0x10;
        }
        else {
          iVar11 = uVar2 * 2;
          if (iVar11 <= (int)uVar2) goto LAB_003d859d;
          ppvVar6 = (p->vData).pArray;
          if (ppvVar6 == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(ppvVar6,(ulong)uVar2 << 4);
          }
          (p->vData).pArray = ppvVar6;
        }
        (p->vData).nCap = iVar11;
      }
LAB_003d859d:
      iVar11 = (p->vData).nSize;
      (p->vData).nSize = iVar11 + 1;
      (p->vData).pArray[iVar11] = puVar4;
      uVar2 = (p->vIndex1).nSize;
      p_00 = (Vec_Int_t *)malloc(0x10);
      if (uVar2 - 1 < 0xf) {
        uVar2 = 0x10;
      }
      p_00->nSize = 0;
      p_00->nCap = uVar2;
      if (uVar2 == 0) {
        piVar7 = (int *)0x0;
      }
      else {
        piVar7 = (int *)malloc((long)(int)uVar2 << 2);
      }
      p_00->pArray = piVar7;
      uVar2 = (p->vDataI).nCap;
      if ((p->vDataI).nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          ppvVar6 = (p->vDataI).pArray;
          if (ppvVar6 == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(ppvVar6,0x80);
          }
          (p->vDataI).pArray = ppvVar6;
          iVar11 = 0x10;
        }
        else {
          iVar11 = uVar2 * 2;
          if (iVar11 <= (int)uVar2) goto LAB_003d866a;
          ppvVar6 = (p->vDataI).pArray;
          if (ppvVar6 == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(ppvVar6,(ulong)uVar2 << 4);
          }
          (p->vDataI).pArray = ppvVar6;
        }
        (p->vDataI).nCap = iVar11;
      }
LAB_003d866a:
      iVar11 = (p->vDataI).nSize;
      (p->vDataI).nSize = iVar11 + 1;
      (p->vDataI).pArray[iVar11] = p_00;
      if (0 < (p->vIndex1).nSize) {
        iVar11 = 0;
        do {
          fVar13 = Vec_StrGetF(vOut,pPos);
          uVar2 = *puVar4;
          if (puVar4[1] == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (*(void **)(puVar4 + 2) == (void *)0x0) {
                pvVar5 = malloc(0x40);
              }
              else {
                pvVar5 = realloc(*(void **)(puVar4 + 2),0x40);
              }
              uVar10 = 0x10;
            }
            else {
              uVar10 = uVar2 * 2;
              if ((int)uVar10 <= (int)uVar2) goto LAB_003d870a;
              if (*(void **)(puVar4 + 2) == (void *)0x0) {
                pvVar5 = malloc((ulong)uVar2 << 3);
              }
              else {
                pvVar5 = realloc(*(void **)(puVar4 + 2),(ulong)uVar2 << 3);
              }
            }
            *(void **)(puVar4 + 2) = pvVar5;
            *puVar4 = uVar10;
          }
LAB_003d870a:
          uVar2 = puVar4[1];
          puVar4[1] = uVar2 + 1;
          *(float *)(*(long *)(puVar4 + 2) + (long)(int)uVar2 * 4) = fVar13;
          Vec_IntPush(p_00,(int)(fVar13 * 1000.0));
          iVar11 = iVar11 + 1;
        } while (iVar11 < (p->vIndex1).nSize);
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < (p->vIndex0).nSize);
  }
  lVar12 = 0;
  do {
    fVar13 = Vec_StrGetF(vOut,pPos);
    p->approx[0][lVar12] = fVar13;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  lVar12 = 0;
  do {
    fVar13 = Vec_StrGetF(vOut,pPos);
    p->approx[1][lVar12] = fVar13;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  lVar12 = 0;
  do {
    fVar13 = Vec_StrGetF(vOut,pPos);
    p->approx[2][lVar12] = fVar13;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 6);
  return;
LAB_003d82f5:
  do {
    fVar13 = Vec_StrGetF(vOut,pPos);
    uVar2 = (p->vIndex0).nCap;
    if ((p->vIndex0).nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        pfVar3 = (p->vIndex0).pArray;
        if (pfVar3 == (float *)0x0) {
          pfVar3 = (float *)malloc(0x40);
        }
        else {
          pfVar3 = (float *)realloc(pfVar3,0x40);
        }
        (p->vIndex0).pArray = pfVar3;
        iVar9 = 0x10;
      }
      else {
        iVar9 = uVar2 * 2;
        if (iVar9 <= (int)uVar2) goto LAB_003d837f;
        pfVar3 = (p->vIndex0).pArray;
        if (pfVar3 == (float *)0x0) {
          pfVar3 = (float *)malloc((ulong)uVar2 << 3);
        }
        else {
          pfVar3 = (float *)realloc(pfVar3,(ulong)uVar2 << 3);
        }
        (p->vIndex0).pArray = pfVar3;
      }
      (p->vIndex0).nCap = iVar9;
    }
LAB_003d837f:
    iVar9 = (p->vIndex0).nSize;
    (p->vIndex0).nSize = iVar9 + 1;
    (p->vIndex0).pArray[iVar9] = fVar13;
    Vec_IntPush(&p->vIndex0I,(int)(fVar13 * 1000.0));
    uVar10 = uVar10 - 1;
  } while (uVar10 != 0);
LAB_003d83ae:
  uVar2 = *pPos;
  iVar9 = uVar2 + 1;
  *pPos = iVar9;
  if (-1 < (int)uVar2) {
    bVar8 = 0;
    uVar10 = 0;
    do {
      if (vOut->nSize <= (int)uVar2) break;
      bVar1 = vOut->pArray[uVar2];
      if (-1 < (char)bVar1) {
        uVar10 = (uint)bVar1 << (bVar8 & 0x1f) | uVar10;
        if (uVar10 == 0) goto LAB_003d84d5;
        goto LAB_003d841c;
      }
      uVar10 = uVar10 | (bVar1 & 0x7f) << (bVar8 & 0x1f);
      iVar11 = uVar2 + 2;
      uVar2 = uVar2 + 1;
      bVar8 = bVar8 + 7;
      *pPos = iVar11;
    } while (-1 < iVar9);
  }
LAB_003d83ef:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Reading library from file.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
static void Abc_SclReadSurface( Vec_Str_t * vOut, int * pPos, SC_Surface * p )
{
    Vec_Flt_t * vVec;
    Vec_Int_t * vVecI;
    int i, j;

    for ( i = Vec_StrGetI(vOut, pPos); i != 0; i-- )
    {
        float Num = Vec_StrGetF(vOut, pPos);
        Vec_FltPush( &p->vIndex0, Num );
        Vec_IntPush( &p->vIndex0I, (int)(MIO_NUM*Num) );
    }

    for ( i = Vec_StrGetI(vOut, pPos); i != 0; i-- )
    {
        float Num = Vec_StrGetF(vOut, pPos);
        Vec_FltPush( &p->vIndex1, Num );
        Vec_IntPush( &p->vIndex1I, (int)(MIO_NUM*Num) );
    }

    for ( i = 0; i < Vec_FltSize(&p->vIndex0); i++ )
    {
        vVec = Vec_FltAlloc( Vec_FltSize(&p->vIndex1) );
        Vec_PtrPush( &p->vData, vVec );
        vVecI = Vec_IntAlloc( Vec_FltSize(&p->vIndex1) );
        Vec_PtrPush( &p->vDataI, vVecI );
        for ( j = 0; j < Vec_FltSize(&p->vIndex1); j++ )
        {
            float Num = Vec_StrGetF(vOut, pPos);
            Vec_FltPush( vVec, Num );
            Vec_IntPush( vVecI, (int)(MIO_NUM*Num) );
        }
    }

    for ( i = 0; i < 3; i++ ) 
        p->approx[0][i] = Vec_StrGetF( vOut, pPos );
    for ( i = 0; i < 4; i++ ) 
        p->approx[1][i] = Vec_StrGetF( vOut, pPos );
    for ( i = 0; i < 6; i++ ) 
        p->approx[2][i] = Vec_StrGetF( vOut, pPos );
}